

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

GLuint gl4cts::CopyImage::getPixelSizeForCompatibilityVerification(GLenum internal_format)

{
  GLuint local_10;
  GLuint size;
  GLenum internal_format_local;
  
  local_10 = Utils::getPixelSizeForFormat(internal_format);
  if (internal_format == 0x8055) {
    local_10 = 1;
  }
  return local_10;
}

Assistant:

GLuint getPixelSizeForCompatibilityVerification(GLenum internal_format)
{
	GLuint size = Utils::getPixelSizeForFormat(internal_format);

	switch (internal_format)
	{
	case GL_RGBA2:
		size = 1;
		break;
	default:
		break;
	}

	return size;
}